

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  int status_value;
  allocator<char> local_119;
  int local_118 [2];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    while( true ) {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,local_118,0);
      if (_Var1 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"CHECK failed: File ",&local_119);
        std::operator+(&local_f0,&local_30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d0,&local_f0,", line ");
        local_118[1] = 0x43b;
        StreamableToString<int>(&local_110,local_118 + 1);
        std::operator+(&local_b0,&local_d0,&local_110);
        std::operator+(&local_90,&local_b0,": ");
        std::operator+(&local_70,&local_90,"waitpid(child_pid_, &status_value, 0)");
        std::operator+(&local_50,&local_70," != -1");
        DeathTestAbort(&local_50);
      }
    }
    (this->super_DeathTestImpl).status_ = local_118[0];
    iVar2 = local_118[0];
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}